

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaemonClient.cpp
# Opt level: O0

void __thiscall
xmrig::DaemonClient::DaemonClient(DaemonClient *this,int id,IClientListener *listener)

{
  void *pvVar1;
  BaseClient *in_RDI;
  int *this_00;
  IClientListener *in_stack_ffffffffffffffb0;
  Timer *this_01;
  undefined8 in_stack_ffffffffffffffb8;
  
  BaseClient::BaseClient
            (in_RDI,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),in_stack_ffffffffffffffb0);
  ITimerListener::ITimerListener((ITimerListener *)(in_RDI + 1));
  IHttpListener::IHttpListener((IHttpListener *)&in_RDI[1].m_quiet);
  (in_RDI->super_IClient)._vptr_IClient = (_func_int **)&PTR__DaemonClient_002b7960;
  in_RDI[1].super_IClient._vptr_IClient = (_func_int **)&PTR__DaemonClient_002b7a50;
  *(undefined ***)&in_RDI[1].m_quiet = &PTR__DaemonClient_002b7a78;
  *(undefined1 *)&in_RDI[1].m_listener = 1;
  this_00 = &in_RDI[1].m_id;
  String::String((String *)this_00);
  this_01 = (Timer *)&in_RDI[1].m_job;
  String::String((String *)this_01);
  String::String((String *)&in_RDI[1].m_job.m_size);
  String::String((String *)&in_RDI[1].m_job.m_clientId.m_size);
  pvVar1 = operator_new(0x10);
  Timer::Timer(this_01,(ITimerListener *)this_00);
  in_RDI[1].m_job.m_extraNonce.m_size = (size_t)pvVar1;
  return;
}

Assistant:

xmrig::DaemonClient::DaemonClient(int id, IClientListener *listener) :
    BaseClient(id, listener),
    m_monero(true)
{
    m_timer = new Timer(this);
}